

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# noise_model_test.cc
# Opt level: O0

void __thiscall
gtest_suite_NoiseModelUpdateTest_::
UpdateSuccessForScaledWhiteNoise<BitDepthParams<unsigned_short,_10,_true>_>::TestBody
          (UpdateSuccessForScaledWhiteNoise<BitDepthParams<unsigned_short,_10,_true>_> *this)

{
  bool bVar1;
  uint *puVar2;
  Message *message;
  char *pcVar3;
  AssertHelper *this_00;
  long in_RDI;
  double dVar4;
  char *expr2;
  AssertionResult gtest_ar_14;
  AssertionResult gtest_ar_13;
  AssertionResult gtest_ar_12;
  AssertionResult gtest_ar_11;
  AssertionResult gtest_ar_10;
  aom_noise_strength_lut_t lut;
  AssertionResult gtest_ar_9;
  AssertionResult gtest_ar_8;
  double expected;
  double a;
  int i_1;
  AssertionResult gtest_ar_7;
  double normalize;
  double kStdEps;
  AssertionResult gtest_ar_6;
  AssertionResult gtest_ar_5;
  AssertionResult gtest_ar_4;
  AssertionResult gtest_ar_3;
  AssertionResult gtest_ar_2;
  AssertionResult gtest_ar_1;
  int i;
  int c_1;
  int n;
  AssertionResult gtest_ar;
  double std;
  int avg;
  int c;
  int x;
  int y;
  int shift;
  double kHighStd;
  double kLowStd;
  double kCoeffEps;
  int height;
  int width;
  aom_noise_model_t *model;
  size_type in_stack_fffffffffffffc88;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *in_stack_fffffffffffffc90;
  anon_enum_32 *in_stack_fffffffffffffc98;
  char *in_stack_fffffffffffffca0;
  char *in_stack_fffffffffffffca8;
  int line;
  ACMRandom *in_stack_fffffffffffffcb0;
  aom_noise_strength_lut_t *in_stack_fffffffffffffcb8;
  Type type;
  AssertHelper *in_stack_fffffffffffffcc0;
  aom_noise_strength_solver_t *in_stack_fffffffffffffcc8;
  NoiseModelUpdateTest<BitDepthParams<unsigned_short,_10,_true>_> *in_stack_fffffffffffffcd0;
  AssertHelper *in_stack_fffffffffffffd10;
  undefined8 local_2d8;
  AssertionResult local_2b8 [2];
  AssertionResult local_298 [2];
  AssertionResult local_278 [2];
  AssertionResult local_258 [2];
  undefined4 local_234;
  AssertionResult local_230 [3];
  AssertionResult local_200 [2];
  AssertionResult local_1e0;
  double local_1d0;
  double local_1c8;
  int local_1bc;
  double in_stack_fffffffffffffe50;
  undefined4 in_stack_fffffffffffffe58;
  undefined4 in_stack_fffffffffffffe5c;
  undefined4 uVar5;
  double in_stack_fffffffffffffe60;
  _Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  in_stack_fffffffffffffe68;
  char *in_stack_fffffffffffffe70;
  char *in_stack_fffffffffffffe78;
  char *expr1;
  AssertionResult local_170 [2];
  AssertionResult local_150 [2];
  int local_12c;
  AssertionResult local_128;
  uint local_114;
  int local_fc;
  AssertionResult local_f8 [2];
  AssertionResult local_d8 [2];
  AssertionResult local_b8;
  int local_a4;
  int local_a0;
  int local_9c;
  int local_78;
  undefined4 local_74;
  AssertionResult local_70;
  undefined1 local_59;
  int local_58 [2];
  undefined8 local_50;
  int local_44;
  int local_40;
  int local_3c;
  int local_38;
  undefined4 local_34;
  undefined8 local_30;
  undefined8 local_28;
  undefined8 local_20;
  int local_18;
  int local_14;
  long local_10;
  
  local_10 = in_RDI + 0x10;
  local_14 = 0x80;
  local_18 = 0x80;
  local_20 = 0x3fac28f5c28f5c29;
  local_28 = 0x3ff0000000000000;
  local_30 = 0x4010000000000000;
  local_34 = 2;
  for (local_38 = 0; local_38 < local_18; local_38 = local_38 + 1) {
    for (local_3c = 0; local_3c < local_14; local_3c = local_3c + 1) {
      for (local_40 = 0; local_40 < 3; local_40 = local_40 + 1) {
        local_44 = 0xf5;
        if (local_38 < local_18 / 2) {
          local_44 = 4;
        }
        local_2d8 = 0x3ff0000000000000;
        if (local_18 / 2 <= local_38) {
          local_2d8 = 0x4010000000000000;
        }
        local_50 = local_2d8;
        local_58[1] = 0xff;
        in_stack_fffffffffffffd10 = (AssertHelper *)(double)(local_44 + 2);
        dVar4 = anon_unknown.dwarf_4f15e6::randn
                          (in_stack_fffffffffffffcb0,(double)in_stack_fffffffffffffca8);
        local_58[0] = (int)((double)in_stack_fffffffffffffd10 + dVar4);
        puVar2 = (uint *)::std::min<int>(local_58 + 1,local_58);
        *(short *)(*(long *)(in_RDI + 0x348 + (long)local_40 * 8) +
                  (long)(local_38 * local_14 + local_3c) * 2) =
             (short)((*puVar2 & 0xff) << ((byte)local_34 & 0x1f));
        *(short *)(*(long *)(in_RDI + 0x360 + (long)local_40 * 8) +
                  (long)(local_38 * local_14 + local_3c) * 2) =
             (short)(local_44 + 2 << ((byte)local_34 & 0x1f));
      }
    }
  }
  message = (Message *)(in_RDI + 0x330);
  ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)(in_RDI + 0x330));
  local_59 = 1;
  ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::assign
            (in_stack_fffffffffffffc90,in_stack_fffffffffffffc88,(value_type_conflict2 *)0x5d7a7c);
  local_74 = 0;
  local_78 = NoiseModelUpdateTest<BitDepthParams<unsigned_short,_10,_true>_>::NoiseModelUpdate
                       (in_stack_fffffffffffffcd0,(int)((ulong)in_stack_fffffffffffffcc8 >> 0x20));
  testing::internal::EqHelper::
  Compare<(unnamed_enum_at__workspace_llm4binary_github_license_all_cmakelists_1510_m_ab_s[P]aom_aom_dsp_noise_model_h:206:1),_int,_nullptr>
            (in_stack_fffffffffffffca8,in_stack_fffffffffffffca0,in_stack_fffffffffffffc98,
             (int *)in_stack_fffffffffffffc90);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_70);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffffcc0);
    testing::AssertionResult::failure_message((AssertionResult *)0x5d7aff);
    testing::internal::AssertHelper::AssertHelper
              (in_stack_fffffffffffffcc0,(Type)((ulong)in_stack_fffffffffffffcb8 >> 0x20),
               (char *)in_stack_fffffffffffffcb0,(int)((ulong)in_stack_fffffffffffffca8 >> 0x20),
               in_stack_fffffffffffffca0);
    testing::internal::AssertHelper::operator=(in_stack_fffffffffffffd10,message);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffc90);
    testing::Message::~Message((Message *)0x5d7b5c);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x5d7bcd);
  local_9c = *(int *)(local_10 + 0x2b8);
  local_a0 = 0;
  do {
    if (2 < local_a0) {
      expr1 = (char *)0x3fc3333333333333;
      expr2 = (char *)(double)(1 << ((byte)local_34 & 0x1f));
      uVar5 = 0x14;
      testing::internal::EqHelper::Compare<int,_int,_nullptr>
                (in_stack_fffffffffffffca8,in_stack_fffffffffffffca0,in_stack_fffffffffffffc98,
                 (int *)in_stack_fffffffffffffc90);
      bVar1 = testing::AssertionResult::operator_cast_to_bool
                        ((AssertionResult *)&stack0xfffffffffffffe60);
      if (!bVar1) {
        testing::Message::Message((Message *)in_stack_fffffffffffffcc0);
        in_stack_fffffffffffffcc8 =
             (aom_noise_strength_solver_t *)
             testing::AssertionResult::failure_message((AssertionResult *)0x5d85d6);
        testing::internal::AssertHelper::AssertHelper
                  (in_stack_fffffffffffffcc0,(Type)((ulong)in_stack_fffffffffffffcb8 >> 0x20),
                   (char *)in_stack_fffffffffffffcb0,(int)((ulong)in_stack_fffffffffffffca8 >> 0x20)
                   ,in_stack_fffffffffffffca0);
        testing::internal::AssertHelper::operator=(in_stack_fffffffffffffd10,message);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffc90);
        testing::Message::~Message((Message *)0x5d8633);
      }
      local_114 = (uint)!bVar1;
      testing::AssertionResult::~AssertionResult((AssertionResult *)0x5d86ba);
      if (local_114 == 0) {
        for (local_1bc = 0; local_1bc < *(int *)(local_10 + 0x198); local_1bc = local_1bc + 1) {
          local_1c8 = (double)local_1bc / 19.0;
          local_1d0 = (1.0 - local_1c8) + local_1c8 * 4.0;
          testing::internal::DoubleNearPredFormat
                    (expr1,expr2,(char *)in_stack_fffffffffffffe68._M_head_impl,
                     in_stack_fffffffffffffe60,(double)CONCAT44(uVar5,in_stack_fffffffffffffe58),
                     in_stack_fffffffffffffe50);
          bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_1e0);
          if (!bVar1) {
            testing::Message::Message((Message *)in_stack_fffffffffffffcc0);
            in_stack_fffffffffffffcc0 =
                 (AssertHelper *)
                 testing::AssertionResult::failure_message((AssertionResult *)0x5d87dd);
            testing::internal::AssertHelper::AssertHelper
                      (in_stack_fffffffffffffcc0,(Type)((ulong)in_stack_fffffffffffffcb8 >> 0x20),
                       (char *)in_stack_fffffffffffffcb0,
                       (int)((ulong)in_stack_fffffffffffffca8 >> 0x20),in_stack_fffffffffffffca0);
            testing::internal::AssertHelper::operator=(in_stack_fffffffffffffd10,message);
            testing::internal::AssertHelper::~AssertHelper
                      ((AssertHelper *)in_stack_fffffffffffffc90);
            testing::Message::~Message((Message *)0x5d883a);
          }
          testing::AssertionResult::~AssertionResult((AssertionResult *)0x5d88a8);
          testing::internal::DoubleNearPredFormat
                    (expr1,expr2,(char *)in_stack_fffffffffffffe68._M_head_impl,
                     in_stack_fffffffffffffe60,(double)CONCAT44(uVar5,in_stack_fffffffffffffe58),
                     in_stack_fffffffffffffe50);
          bVar1 = testing::AssertionResult::operator_cast_to_bool(local_200);
          if (!bVar1) {
            testing::Message::Message((Message *)in_stack_fffffffffffffcc0);
            in_stack_fffffffffffffcb8 =
                 (aom_noise_strength_lut_t *)
                 testing::AssertionResult::failure_message((AssertionResult *)0x5d8943);
            testing::internal::AssertHelper::AssertHelper
                      (in_stack_fffffffffffffcc0,(Type)((ulong)in_stack_fffffffffffffcb8 >> 0x20),
                       (char *)in_stack_fffffffffffffcb0,
                       (int)((ulong)in_stack_fffffffffffffca8 >> 0x20),in_stack_fffffffffffffca0);
            testing::internal::AssertHelper::operator=(in_stack_fffffffffffffd10,message);
            testing::internal::AssertHelper::~AssertHelper
                      ((AssertHelper *)in_stack_fffffffffffffc90);
            testing::Message::~Message((Message *)0x5d89a0);
          }
          testing::AssertionResult::~AssertionResult((AssertionResult *)0x5d8a0b);
        }
        aom_noise_strength_solver_fit_piecewise
                  (in_stack_fffffffffffffcc8,(int)((ulong)in_stack_fffffffffffffcc0 >> 0x20),
                   in_stack_fffffffffffffcb8);
        type = (Type)((ulong)in_stack_fffffffffffffcb8 >> 0x20);
        local_234 = 2;
        testing::internal::EqHelper::Compare<int,_int,_nullptr>
                  (in_stack_fffffffffffffca8,in_stack_fffffffffffffca0,in_stack_fffffffffffffc98,
                   (int *)in_stack_fffffffffffffc90);
        line = (int)((ulong)in_stack_fffffffffffffca8 >> 0x20);
        bVar1 = testing::AssertionResult::operator_cast_to_bool(local_230);
        if (!bVar1) {
          testing::Message::Message((Message *)in_stack_fffffffffffffcc0);
          in_stack_fffffffffffffcb0 =
               (ACMRandom *)testing::AssertionResult::failure_message((AssertionResult *)0x5d8ac6);
          testing::internal::AssertHelper::AssertHelper
                    (in_stack_fffffffffffffcc0,type,(char *)in_stack_fffffffffffffcb0,line,
                     in_stack_fffffffffffffca0);
          testing::internal::AssertHelper::operator=(in_stack_fffffffffffffd10,message);
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffc90);
          testing::Message::~Message((Message *)0x5d8b23);
        }
        local_114 = (uint)!bVar1;
        testing::AssertionResult::~AssertionResult((AssertionResult *)0x5d8ba7);
        if (local_114 == 0) {
          testing::internal::DoubleNearPredFormat
                    (expr1,expr2,(char *)in_stack_fffffffffffffe68._M_head_impl,
                     in_stack_fffffffffffffe60,(double)CONCAT44(uVar5,in_stack_fffffffffffffe58),
                     in_stack_fffffffffffffe50);
          bVar1 = testing::AssertionResult::operator_cast_to_bool(local_258);
          if (!bVar1) {
            testing::Message::Message((Message *)in_stack_fffffffffffffcc0);
            pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)0x5d8c38);
            line = (int)((ulong)pcVar3 >> 0x20);
            testing::internal::AssertHelper::AssertHelper
                      (in_stack_fffffffffffffcc0,type,(char *)in_stack_fffffffffffffcb0,line,
                       in_stack_fffffffffffffca0);
            testing::internal::AssertHelper::operator=(in_stack_fffffffffffffd10,message);
            testing::internal::AssertHelper::~AssertHelper
                      ((AssertHelper *)in_stack_fffffffffffffc90);
            testing::Message::~Message((Message *)0x5d8c95);
          }
          testing::AssertionResult::~AssertionResult((AssertionResult *)0x5d8d03);
          testing::internal::DoubleNearPredFormat
                    (expr1,expr2,(char *)in_stack_fffffffffffffe68._M_head_impl,
                     in_stack_fffffffffffffe60,(double)CONCAT44(uVar5,in_stack_fffffffffffffe58),
                     in_stack_fffffffffffffe50);
          bVar1 = testing::AssertionResult::operator_cast_to_bool(local_278);
          if (!bVar1) {
            testing::Message::Message((Message *)in_stack_fffffffffffffcc0);
            in_stack_fffffffffffffca0 =
                 testing::AssertionResult::failure_message((AssertionResult *)0x5d8d91);
            testing::internal::AssertHelper::AssertHelper
                      (in_stack_fffffffffffffcc0,type,(char *)in_stack_fffffffffffffcb0,line,
                       in_stack_fffffffffffffca0);
            testing::internal::AssertHelper::operator=(in_stack_fffffffffffffd10,message);
            testing::internal::AssertHelper::~AssertHelper
                      ((AssertHelper *)in_stack_fffffffffffffc90);
            testing::Message::~Message((Message *)0x5d8dee);
          }
          testing::AssertionResult::~AssertionResult((AssertionResult *)0x5d8e5c);
          testing::internal::DoubleNearPredFormat
                    (expr1,expr2,(char *)in_stack_fffffffffffffe68._M_head_impl,
                     in_stack_fffffffffffffe60,(double)CONCAT44(uVar5,in_stack_fffffffffffffe58),
                     in_stack_fffffffffffffe50);
          bVar1 = testing::AssertionResult::operator_cast_to_bool(local_298);
          if (!bVar1) {
            testing::Message::Message((Message *)in_stack_fffffffffffffcc0);
            testing::AssertionResult::failure_message((AssertionResult *)0x5d8ee1);
            testing::internal::AssertHelper::AssertHelper
                      (in_stack_fffffffffffffcc0,type,(char *)in_stack_fffffffffffffcb0,line,
                       in_stack_fffffffffffffca0);
            testing::internal::AssertHelper::operator=(in_stack_fffffffffffffd10,message);
            testing::internal::AssertHelper::~AssertHelper
                      ((AssertHelper *)in_stack_fffffffffffffc90);
            testing::Message::~Message((Message *)0x5d8f3e);
          }
          testing::AssertionResult::~AssertionResult((AssertionResult *)0x5d8fac);
          testing::internal::DoubleNearPredFormat
                    (expr1,expr2,(char *)in_stack_fffffffffffffe68._M_head_impl,
                     in_stack_fffffffffffffe60,(double)CONCAT44(uVar5,in_stack_fffffffffffffe58),
                     in_stack_fffffffffffffe50);
          bVar1 = testing::AssertionResult::operator_cast_to_bool(local_2b8);
          if (!bVar1) {
            testing::Message::Message((Message *)in_stack_fffffffffffffcc0);
            this_00 = (AssertHelper *)
                      testing::AssertionResult::failure_message((AssertionResult *)0x5d903a);
            testing::internal::AssertHelper::AssertHelper
                      (in_stack_fffffffffffffcc0,type,(char *)in_stack_fffffffffffffcb0,line,
                       in_stack_fffffffffffffca0);
            testing::internal::AssertHelper::operator=(in_stack_fffffffffffffd10,message);
            testing::internal::AssertHelper::~AssertHelper(this_00);
            testing::Message::~Message((Message *)0x5d9097);
          }
          testing::AssertionResult::~AssertionResult((AssertionResult *)0x5d9102);
          aom_noise_strength_lut_free((aom_noise_strength_lut_t *)0x5d910f);
        }
      }
      return;
    }
    for (local_a4 = 0; local_a4 < local_9c; local_a4 = local_a4 + 1) {
      testing::internal::DoubleNearPredFormat
                (in_stack_fffffffffffffe78,in_stack_fffffffffffffe70,
                 (char *)in_stack_fffffffffffffe68._M_head_impl,in_stack_fffffffffffffe60,
                 (double)CONCAT44(in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58),
                 in_stack_fffffffffffffe50);
      bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_b8);
      if (!bVar1) {
        testing::Message::Message((Message *)in_stack_fffffffffffffcc0);
        testing::AssertionResult::failure_message((AssertionResult *)0x5d7cbb);
        testing::internal::AssertHelper::AssertHelper
                  (in_stack_fffffffffffffcc0,(Type)((ulong)in_stack_fffffffffffffcb8 >> 0x20),
                   (char *)in_stack_fffffffffffffcb0,(int)((ulong)in_stack_fffffffffffffca8 >> 0x20)
                   ,in_stack_fffffffffffffca0);
        testing::internal::AssertHelper::operator=(in_stack_fffffffffffffd10,message);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffc90);
        testing::Message::~Message((Message *)0x5d7d18);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)0x5d7d86);
      testing::internal::DoubleNearPredFormat
                (in_stack_fffffffffffffe78,in_stack_fffffffffffffe70,
                 (char *)in_stack_fffffffffffffe68._M_head_impl,in_stack_fffffffffffffe60,
                 (double)CONCAT44(in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58),
                 in_stack_fffffffffffffe50);
      bVar1 = testing::AssertionResult::operator_cast_to_bool(local_d8);
      if (!bVar1) {
        testing::Message::Message((Message *)in_stack_fffffffffffffcc0);
        testing::AssertionResult::failure_message((AssertionResult *)0x5d7e25);
        testing::internal::AssertHelper::AssertHelper
                  (in_stack_fffffffffffffcc0,(Type)((ulong)in_stack_fffffffffffffcb8 >> 0x20),
                   (char *)in_stack_fffffffffffffcb0,(int)((ulong)in_stack_fffffffffffffca8 >> 0x20)
                   ,in_stack_fffffffffffffca0);
        testing::internal::AssertHelper::operator=(in_stack_fffffffffffffd10,message);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffc90);
        testing::Message::~Message((Message *)0x5d7e82);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)0x5d7eed);
    }
    if (0 < local_a0) {
      local_fc = local_9c + 1;
      testing::internal::EqHelper::Compare<int,_int,_nullptr>
                (in_stack_fffffffffffffca8,in_stack_fffffffffffffca0,in_stack_fffffffffffffc98,
                 (int *)in_stack_fffffffffffffc90);
      bVar1 = testing::AssertionResult::operator_cast_to_bool(local_f8);
      if (!bVar1) {
        testing::Message::Message((Message *)in_stack_fffffffffffffcc0);
        testing::AssertionResult::failure_message((AssertionResult *)0x5d7fad);
        testing::internal::AssertHelper::AssertHelper
                  (in_stack_fffffffffffffcc0,(Type)((ulong)in_stack_fffffffffffffcb8 >> 0x20),
                   (char *)in_stack_fffffffffffffcb0,(int)((ulong)in_stack_fffffffffffffca8 >> 0x20)
                   ,in_stack_fffffffffffffca0);
        testing::internal::AssertHelper::operator=(in_stack_fffffffffffffd10,message);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffc90);
        testing::Message::~Message((Message *)0x5d800a);
      }
      local_114 = (uint)!bVar1;
      testing::AssertionResult::~AssertionResult((AssertionResult *)0x5d8091);
      if (local_114 != 0) {
        return;
      }
      local_12c = local_9c + 1;
      testing::internal::EqHelper::Compare<int,_int,_nullptr>
                (in_stack_fffffffffffffca8,in_stack_fffffffffffffca0,in_stack_fffffffffffffc98,
                 (int *)in_stack_fffffffffffffc90);
      bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_128);
      if (!bVar1) {
        testing::Message::Message((Message *)in_stack_fffffffffffffcc0);
        testing::AssertionResult::failure_message((AssertionResult *)0x5d813c);
        testing::internal::AssertHelper::AssertHelper
                  (in_stack_fffffffffffffcc0,(Type)((ulong)in_stack_fffffffffffffcb8 >> 0x20),
                   (char *)in_stack_fffffffffffffcb0,(int)((ulong)in_stack_fffffffffffffca8 >> 0x20)
                   ,in_stack_fffffffffffffca0);
        testing::internal::AssertHelper::operator=(in_stack_fffffffffffffd10,message);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffc90);
        testing::Message::~Message((Message *)0x5d8199);
      }
      local_114 = (uint)!bVar1;
      testing::AssertionResult::~AssertionResult((AssertionResult *)0x5d8220);
      if (local_114 != 0) {
        return;
      }
      testing::internal::DoubleNearPredFormat
                (in_stack_fffffffffffffe78,in_stack_fffffffffffffe70,
                 (char *)in_stack_fffffffffffffe68._M_head_impl,in_stack_fffffffffffffe60,
                 (double)CONCAT44(in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58),
                 in_stack_fffffffffffffe50);
      bVar1 = testing::AssertionResult::operator_cast_to_bool(local_150);
      if (!bVar1) {
        testing::Message::Message((Message *)in_stack_fffffffffffffcc0);
        testing::AssertionResult::failure_message((AssertionResult *)0x5d82d3);
        testing::internal::AssertHelper::AssertHelper
                  (in_stack_fffffffffffffcc0,(Type)((ulong)in_stack_fffffffffffffcb8 >> 0x20),
                   (char *)in_stack_fffffffffffffcb0,(int)((ulong)in_stack_fffffffffffffca8 >> 0x20)
                   ,in_stack_fffffffffffffca0);
        testing::internal::AssertHelper::operator=(in_stack_fffffffffffffd10,message);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffc90);
        testing::Message::~Message((Message *)0x5d8330);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)0x5d839e);
      testing::internal::DoubleNearPredFormat
                (in_stack_fffffffffffffe78,in_stack_fffffffffffffe70,
                 (char *)in_stack_fffffffffffffe68._M_head_impl,in_stack_fffffffffffffe60,
                 (double)CONCAT44(in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58),
                 in_stack_fffffffffffffe50);
      bVar1 = testing::AssertionResult::operator_cast_to_bool(local_170);
      if (!bVar1) {
        testing::Message::Message((Message *)in_stack_fffffffffffffcc0);
        testing::AssertionResult::failure_message((AssertionResult *)0x5d843d);
        testing::internal::AssertHelper::AssertHelper
                  (in_stack_fffffffffffffcc0,(Type)((ulong)in_stack_fffffffffffffcb8 >> 0x20),
                   (char *)in_stack_fffffffffffffcb0,(int)((ulong)in_stack_fffffffffffffca8 >> 0x20)
                   ,in_stack_fffffffffffffca0);
        testing::internal::AssertHelper::operator=(in_stack_fffffffffffffd10,message);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffc90);
        testing::Message::~Message((Message *)0x5d849a);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)0x5d8505);
    }
    local_a0 = local_a0 + 1;
  } while( true );
}

Assistant:

TYPED_TEST_P(NoiseModelUpdateTest, UpdateSuccessForScaledWhiteNoise) {
  aom_noise_model_t &model = this->model_;
  const int width = this->kWidth;
  const int height = this->kHeight;

  const double kCoeffEps = 0.055;
  const double kLowStd = 1;
  const double kHighStd = 4;
  const int shift = this->kBitDepth - 8;
  for (int y = 0; y < height; ++y) {
    for (int x = 0; x < width; ++x) {
      for (int c = 0; c < 3; ++c) {
        // The image data is bimodal:
        // Bottom half has low intensity and low noise strength
        // Top half has high intensity and high noise strength
        const int avg = (y < height / 2) ? 4 : 245;
        const double std = (y < height / 2) ? kLowStd : kHighStd;
        this->data_ptr_[c][y * width + x] =
            ((uint8_t)std::min((int)255,
                               (int)(2 + avg + randn(&this->random_, std))))
            << shift;
        this->denoised_ptr_[c][y * width + x] = (2 + avg) << shift;
      }
    }
  }
  // Label all blocks as flat for the update
  this->flat_blocks_.assign(this->flat_blocks_.size(), 1);
  EXPECT_EQ(AOM_NOISE_STATUS_OK, this->NoiseModelUpdate());

  const int n = model.n;
  // The noise is uncorrelated spatially and with the y channel.
  // All coefficients should be reasonably close to zero.
  for (int c = 0; c < 3; ++c) {
    for (int i = 0; i < n; ++i) {
      EXPECT_NEAR(0, model.latest_state[c].eqns.x[i], kCoeffEps);
      EXPECT_NEAR(0, model.combined_state[c].eqns.x[i], kCoeffEps);
    }
    if (c > 0) {
      ASSERT_EQ(n + 1, model.latest_state[c].eqns.n);
      ASSERT_EQ(n + 1, model.combined_state[c].eqns.n);

      // The correlation to the y channel should be low (near zero)
      EXPECT_NEAR(0, model.latest_state[c].eqns.x[n], kCoeffEps);
      EXPECT_NEAR(0, model.combined_state[c].eqns.x[n], kCoeffEps);
    }
  }

  // Noise strength should vary between kLowStd and kHighStd.
  const double kStdEps = 0.15;
  // We have to normalize fitted standard deviation based on bit depth.
  const double normalize = (1 << shift);

  ASSERT_EQ(20, model.latest_state[0].strength_solver.eqns.n);
  for (int i = 0; i < model.latest_state[0].strength_solver.eqns.n; ++i) {
    const double a = i / 19.0;
    const double expected = (kLowStd * (1.0 - a) + kHighStd * a);
    EXPECT_NEAR(expected,
                model.latest_state[0].strength_solver.eqns.x[i] / normalize,
                kStdEps);
    EXPECT_NEAR(expected,
                model.combined_state[0].strength_solver.eqns.x[i] / normalize,
                kStdEps);
  }

  // If we fit a piecewise linear model, there should be two points:
  // one near kLowStd at 0, and the other near kHighStd and 255.
  aom_noise_strength_lut_t lut;
  aom_noise_strength_solver_fit_piecewise(
      &model.latest_state[0].strength_solver, 2, &lut);
  ASSERT_EQ(2, lut.num_points);
  EXPECT_NEAR(0, lut.points[0][0], 1e-4);
  EXPECT_NEAR(kLowStd, lut.points[0][1] / normalize, kStdEps);
  EXPECT_NEAR((1 << this->kBitDepth) - 1, lut.points[1][0], 1e-5);
  EXPECT_NEAR(kHighStd, lut.points[1][1] / normalize, kStdEps);
  aom_noise_strength_lut_free(&lut);
}